

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O0

void __thiscall btLCP::pN_plusequals_s_times_qN(btLCP *this,btScalar *p,btScalar s,btScalar *q)

{
  int iVar1;
  int iVar2;
  int i;
  int nN;
  btScalar *qsrc;
  btScalar *ptgt;
  int nC;
  btScalar *q_local;
  btScalar s_local;
  btScalar *p_local;
  btLCP *this_local;
  
  iVar1 = this->m_nC;
  iVar2 = this->m_nN;
  for (i = 0; i < iVar2; i = i + 1) {
    p[(long)iVar1 + (long)i] = s * q[(long)iVar1 + (long)i] + p[(long)iVar1 + (long)i];
  }
  return;
}

Assistant:

void btLCP::pN_plusequals_s_times_qN (btScalar *p, btScalar s, btScalar *q)
{
  const int nC = m_nC;
  btScalar *ptgt = p + nC, *qsrc = q + nC;
  const int nN = m_nN;
  for (int i=0; i<nN; ++i) {
    ptgt[i] += s*qsrc[i];
  }
}